

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::
GenerateNewReflectiveBlockingServiceMethod(ImmutableServiceGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "public static com.google.protobuf.BlockingService\n    newReflectiveBlockingService(final BlockingInterface impl) {\n  return new com.google.protobuf.BlockingService() {\n"
            );
  protobuf::io::Printer::Print<>(printer,local_28);
  protobuf::io::Printer::Indent(local_18);
  protobuf::io::Printer::Indent(local_18);
  GenerateGetDescriptorForType(this,local_18);
  GenerateCallBlockingMethod(this,local_18);
  GenerateGetPrototype(this,REQUEST,local_18);
  GenerateGetPrototype(this,RESPONSE,local_18);
  protobuf::io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"};\n");
  protobuf::io::Printer::Print<>(pPVar1,local_38);
  protobuf::io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"}\n\n");
  protobuf::io::Printer::Print<>(pPVar1,local_48);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveBlockingServiceMethod(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.BlockingService\n"
      "    newReflectiveBlockingService(final BlockingInterface impl) {\n"
      "  return new com.google.protobuf.BlockingService() {\n");
  printer->Indent();
  printer->Indent();

  GenerateGetDescriptorForType(printer);

  GenerateCallBlockingMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}